

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O1

bool __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::set
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this,uint64_t key,uint64_t val)

{
  pointer psVar1;
  ulong uVar2;
  bool bVar3;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> local_58;
  
  if ((this->table_).
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->table_).
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    standard_hash_table(&local_58,6);
    std::
    vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
    ::_M_move_assign(&this->table_,&local_58);
    this->size_ = local_58.size_;
    this->max_size_ = local_58.max_size_;
    (this->capa_size_).bits_ = local_58.capa_size_.bits_;
    *(undefined4 *)&(this->capa_size_).field_0x4 = local_58.capa_size_._4_4_;
    (this->capa_size_).mask_ = local_58.capa_size_.mask_;
    if (local_58.table_.
        super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.table_.
                      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.table_.
                            super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.table_.
                            super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (this->max_size_ <= this->size_) {
    expand_(this);
  }
  uVar2 = (key >> 0x1e ^ key) * -0x40a7b892e31b1a47;
  uVar2 = (uVar2 >> 0x1b ^ uVar2) * -0x6b2fb644ecceee15;
  uVar2 = uVar2 >> 0x1f ^ uVar2;
  psVar1 = (this->table_).
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    uVar2 = uVar2 & (this->capa_size_).mask_;
    bVar3 = psVar1[uVar2].key == 0xffffffffffffffff;
    if (bVar3) {
      psVar1[uVar2].key = key;
      psVar1[uVar2].val = val;
      this->size_ = this->size_ + 1;
      return bVar3;
    }
    if (psVar1[uVar2].key == key) break;
    uVar2 = uVar2 + 1;
  }
  psVar1[uVar2].val = val;
  return bVar3;
}

Assistant:

bool set(uint64_t key, uint64_t val) {
        if (table_.empty()) {
            *this = this_type(min_capa_bits);
        }

        if (max_size_ <= size_) {
            expand_();
        }

        for (uint64_t i = init_id_(key);; i = right_(i)) {
            if (table_[i].key == UINT64_MAX) {
                table_[i] = {key, val};
                ++size_;
                return true;
            }
            if (table_[i].key == key) {
                table_[i].val = val;
                return false;
            }
        }
    }